

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O2

TPZGeoEl * __thiscall
TPZGeoMesh::CreateGeoElement
          (TPZGeoMesh *this,MElementType type,TPZVec<long> *nodeindexes,int matid,int64_t *index,
          int reftype)

{
  ostream *poVar1;
  TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *this_00;
  
  if (reftype == 0) {
    switch(type) {
    case EPoint:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x70);
      TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoPoint,_pzrefine::TPZRefPoint> *)this_00,nodeindexes,
                 matid,this,index);
      break;
    case EOned:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0xb0);
      TPZGeoElement<pzgeom::TPZGeoLinear,_pzrefine::TPZRefLinear>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoLinear,_pzrefine::TPZRefLinear> *)this_00,nodeindexes,
                 matid,this,index);
      break;
    case ETriangle:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x128);
      TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoTriangle,_pzrefine::TPZRefTriangle> *)this_00,
                 nodeindexes,matid,this,index);
      break;
    case EQuadrilateral:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x160);
      TPZGeoElement<pzgeom::TPZGeoQuad,_pzrefine::TPZRefQuad>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoQuad,_pzrefine::TPZRefQuad> *)this_00,nodeindexes,
                 matid,this,index);
      break;
    case ETetraedro:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x200);
      TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoTetrahedra,_pzrefine::TPZRefTetrahedra> *)this_00,
                 nodeindexes,matid,this,index);
      break;
    case EPiramide:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x288);
      TPZGeoElement<pzgeom::TPZGeoPyramid,_pzrefine::TPZRefPyramid>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoPyramid,_pzrefine::TPZRefPyramid> *)this_00,
                 nodeindexes,matid,this,index);
      break;
    case EPrisma:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x2b0);
      TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism>::TPZGeoElement
                ((TPZGeoElement<pzgeom::TPZGeoPrism,_pzrefine::TPZRefPrism> *)this_00,nodeindexes,
                 matid,this,index);
      break;
    case ECube:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x350);
      TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube>::TPZGeoElement
                (this_00,nodeindexes,matid,this,index);
      break;
    default:
      goto switchD_010155df_default;
    }
  }
  else {
    switch(type) {
    case EPoint:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x90);
      TPZGeoElRefPattern<pzgeom::TPZGeoPoint>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPoint> *)this_00,nodeindexes,matid,this,index);
      break;
    case EOned:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(200);
      TPZGeoElRefPattern<pzgeom::TPZGeoLinear>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoLinear> *)this_00,nodeindexes,matid,this,index);
      break;
    case ETriangle:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x130);
      TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *)this_00,nodeindexes,matid,this,index)
      ;
      break;
    case EQuadrilateral:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x168);
      TPZGeoElRefPattern<pzgeom::TPZGeoQuad>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoQuad> *)this_00,nodeindexes,matid,this,index);
      break;
    case ETetraedro:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x1f8);
      TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoTetrahedra> *)this_00,nodeindexes,matid,this,
                 index);
      break;
    case EPiramide:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x260);
      TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *)this_00,nodeindexes,matid,this,index);
      break;
    case EPrisma:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x298);
      TPZGeoElRefPattern<pzgeom::TPZGeoPrism>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoPrism> *)this_00,nodeindexes,matid,this,index);
      break;
    case ECube:
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)operator_new(0x338);
      TPZGeoElRefPattern<pzgeom::TPZGeoCube>::TPZGeoElRefPattern
                ((TPZGeoElRefPattern<pzgeom::TPZGeoCube> *)this_00,nodeindexes,matid,this,index);
      break;
    default:
switchD_010155df_default:
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "TPZGeoMesh::CreateGeoElement type element not exists:");
      poVar1 = std::operator<<(poVar1," type = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,type);
      std::endl<char,std::char_traits<char>>(poVar1);
      this_00 = (TPZGeoElement<pzgeom::TPZGeoCube,_pzrefine::TPZRefCube> *)0x0;
    }
  }
  return (TPZGeoEl *)this_00;
}

Assistant:

TPZGeoEl *TPZGeoMesh::CreateGeoElement(MElementType type,
                                       TPZVec<int64_t>& nodeindexes,
                                       int matid,
                                       int64_t& index,
                                       int reftype){
    
#ifdef PZDEBUG
    {
        for (int i=0; i<nodeindexes.size(); i++) {
            if (nodeindexes[i] < 0) {
                DebugStop();
            }
        }
    }
#endif
	if (reftype == 0)
    {
        switch( type )
        {
            case 0://point
                return new TPZGeoElement< TPZGeoPoint, TPZRefPoint>(nodeindexes, matid, *this, index );
            case 1://line
                return new TPZGeoElement< TPZGeoLinear, TPZRefLinear>(nodeindexes, matid, *this, index );
            case 2://triangle
                return new TPZGeoElement< TPZGeoTriangle, TPZRefTriangle >(nodeindexes, matid, *this, index );
            case 3://quadrilatera
                return  new TPZGeoElement< TPZGeoQuad, TPZRefQuad >(nodeindexes, matid, *this, index );
            case 4://tetraedra
                return new TPZGeoElement< TPZGeoTetrahedra, TPZRefTetrahedra >(nodeindexes, matid, *this, index );
            case 5:
                return new TPZGeoElement< TPZGeoPyramid, TPZRefPyramid >(nodeindexes, matid, *this, index );
            case 6:
                return new TPZGeoElement< TPZGeoPrism, TPZRefPrism >(nodeindexes, matid, *this, index );
            case 7:
                return new TPZGeoElement< TPZGeoCube, TPZRefCube >(nodeindexes, matid, *this, index );
            default:
                PZError << "TPZGeoMesh::CreateGeoElement type element not exists:"
                << " type = " << type << std::endl;
                return NULL;
        }
    }
	else
	{
		//TPZAutoPointer<TPZRefPattern> ref = GetUniformPattern(type);
		switch( type )
		{
			case 0://point
			{
				TPZGeoElRefPattern<TPZGeoPoint> * gel = new TPZGeoElRefPattern<TPZGeoPoint> (nodeindexes, matid, *this, index);
				return gel;
			}
			case 1://line
			{
				TPZGeoElRefPattern < TPZGeoLinear > *gel = new TPZGeoElRefPattern < TPZGeoLinear >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 2://triangle
			{
				TPZGeoElRefPattern < TPZGeoTriangle > *gel = new TPZGeoElRefPattern < TPZGeoTriangle >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 3://quadrilatera
			{
				TPZGeoElRefPattern < TPZGeoQuad > * gel = new TPZGeoElRefPattern < TPZGeoQuad >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 4://tetraedra
			{
				TPZGeoElRefPattern < TPZGeoTetrahedra > *gel = new TPZGeoElRefPattern < TPZGeoTetrahedra >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 5://pyramid
			{
				TPZGeoElRefPattern < TPZGeoPyramid > *gel = new TPZGeoElRefPattern < TPZGeoPyramid >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 6://prism
			{
				TPZGeoElRefPattern < TPZGeoPrism > *gel = new TPZGeoElRefPattern < TPZGeoPrism >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			case 7://cube
			{
				TPZGeoElRefPattern < TPZGeoCube > *gel = new TPZGeoElRefPattern < TPZGeoCube >(nodeindexes, matid, *this, index);
				//gel->SetRefPattern (ref);
				return gel;
			}
			default:
			{
				PZError << "TPZGeoMesh::CreateGeoElement type element not exists:"
                << " type = " << type << std::endl;
				return NULL;
			}
		}
	}
	//return NULL;
}